

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> * __thiscall
tinyusdz::Xformable::xformOpOrder
          (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__return_storage_ptr__,
          Xformable *this)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong uVar3;
  OpType *extraout_RDX;
  OpType *extraout_RDX_00;
  OpType *op;
  Token local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  undefined1 local_b8 [8];
  value_type xformOp;
  string ss;
  size_t i;
  Xformable *this_local;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *toks;
  
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector(__return_storage_ptr__);
  for (ss.field_2._8_8_ = 0;
      sVar1 = ::std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::size
                        (&this->xformOps), (ulong)ss.field_2._8_8_ < sVar1;
      ss.field_2._8_8_ = ss.field_2._8_8_ + 1) {
    ::std::__cxx11::string::string((string *)&xformOp._is_blocked);
    pvVar2 = ::std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::operator[]
                       (&this->xformOps,ss.field_2._8_8_);
    XformOp::XformOp((XformOp *)local_b8,pvVar2);
    op = extraout_RDX;
    if ((local_b8[4] & 1U) != 0) {
      ::std::__cxx11::string::operator+=((string *)&xformOp._is_blocked,"!invert!");
      op = extraout_RDX_00;
    }
    tinyusdz::to_string_abi_cxx11_(&local_d8,(tinyusdz *)local_b8,op);
    ::std::__cxx11::string::operator+=((string *)&xformOp._is_blocked,(string *)&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      ::std::operator+(&local_f8,":",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xformOp
                      );
      ::std::__cxx11::string::operator+=((string *)&xformOp._is_blocked,(string *)&local_f8);
      ::std::__cxx11::string::~string((string *)&local_f8);
    }
    Token::Token(&local_118,(string *)&xformOp._is_blocked);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::push_back
              (__return_storage_ptr__,&local_118);
    Token::~Token(&local_118);
    XformOp::~XformOp((XformOp *)local_b8);
    ::std::__cxx11::string::~string((string *)&xformOp._is_blocked);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<value::token> Xformable::xformOpOrder() const {
  std::vector<value::token> toks;

  for (size_t i = 0; i < xformOps.size(); i++) {
    std::string ss;

    auto xformOp = xformOps[i];

    if (xformOp.inverted) {
      ss += "!invert!";
    }
    ss += to_string(xformOp.op_type);
    if (!xformOp.suffix.empty()) {
      ss += ":" + xformOp.suffix;
    }

    toks.push_back(value::token(ss));
  }

  return toks;
}